

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

QSize __thiscall QAbstractSpinBox::minimumSizeHint(QAbstractSpinBox *this)

{
  long *plVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  QStyle *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  QFontMetrics fm;
  QStyleOptionSpinBox opt;
  int local_e0;
  undefined4 local_dc;
  QString local_d8;
  QString local_b8;
  undefined1 *local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(this + 8);
  if (((int)plVar1[0x6e] < 1) || (*(int *)((long)plVar1 + 0x374) < 1)) {
    QWidget::ensurePolished((QWidget *)this);
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_a0,(QFont *)(*(long *)(this + 0x20) + 0x38));
    (**(code **)(*(long *)plVar1[0x6f] + 0x78))();
    local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = plVar1 + 0x4b;
    local_98._8_2_ = L' ';
    QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>
              (&local_d8,(QStringBuilder<const_QString_&,_char16_t> *)local_98);
    (**(code **)(*plVar1 + 0xd8))(local_98,plVar1,plVar1 + 0x58);
    local_b8.d.d = (Data *)local_98._0_8_;
    local_b8.d.ptr = (char16_t *)local_98._8_8_;
    local_b8.d.size = (qsizetype)local_88;
    QString::truncate((longlong)&local_b8);
    QString::append((QString *)&local_b8);
    iVar6 = QFontMetrics::horizontalAdvance((QString *)&local_a0,(int)&local_b8);
    (**(code **)(*plVar1 + 0xd8))(local_98,plVar1,plVar1 + 0x5c);
    puVar5 = local_88;
    uVar4 = local_98._0_8_;
    pcVar3 = local_b8.d.ptr;
    pDVar2 = local_b8.d.d;
    local_98._0_8_ = local_b8.d.d;
    local_b8.d.d = (Data *)uVar4;
    local_b8.d.ptr = (char16_t *)local_98._8_8_;
    local_98._8_8_ = pcVar3;
    local_88 = (undefined1 *)local_b8.d.size;
    local_b8.d.size = (qsizetype)puVar5;
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    QString::truncate((longlong)&local_b8);
    QString::append((QString *)&local_b8);
    iVar7 = QFontMetrics::horizontalAdvance((QString *)&local_a0,(int)&local_b8);
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    iVar6 = 0;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
    if (plVar1[0x53] != 0) {
      QString::operator=(&local_b8,(QString *)(plVar1 + 0x51));
      iVar7 = QFontMetrics::horizontalAdvance((QString *)&local_a0,(int)&local_b8);
      if (iVar6 <= iVar7) {
        iVar6 = iVar7;
      }
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)local_98);
    (**(code **)(*(long *)this + 0x1c0))(this,(QStyleOptionSpinBox *)local_98);
    local_e0 = iVar6 + 2;
    local_dc = extraout_var;
    pQVar8 = QWidget::style((QWidget *)this);
    lVar9 = (**(code **)(*(long *)pQVar8 + 0xe8))
                      (pQVar8,0xf,(QStyleOptionSpinBox *)local_98,&local_e0,this);
    plVar1[0x6e] = lVar9;
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_a0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(QSize *)(plVar1 + 0x6e);
  }
  __stack_chk_fail();
}

Assistant:

QSize QAbstractSpinBox::minimumSizeHint() const
{
    Q_D(const QAbstractSpinBox);
    if (d->cachedMinimumSizeHint.isEmpty()) {
        //Use the prefix and range to calculate the minimumSizeHint
        ensurePolished();

        const QFontMetrics fm(fontMetrics());
        int h = d->edit->minimumSizeHint().height();
        int w = 0;

        QString s;
        QString fixedContent =  d->prefix + u' ';
        s = d->textFromValue(d->minimum);
        s.truncate(18);
        s += fixedContent;
        w = qMax(w, fm.horizontalAdvance(s));
        s = d->textFromValue(d->maximum);
        s.truncate(18);
        s += fixedContent;
        w = qMax(w, fm.horizontalAdvance(s));

        if (d->specialValueText.size()) {
            s = d->specialValueText;
            w = qMax(w, fm.horizontalAdvance(s));
        }
        w += 2; // cursor blinking space

        QStyleOptionSpinBox opt;
        initStyleOption(&opt);
        QSize hint(w, h);

        d->cachedMinimumSizeHint = style()->sizeFromContents(QStyle::CT_SpinBox, &opt, hint, this);
    }
    return d->cachedMinimumSizeHint;
}